

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::EntryShift(RecyclableObject *function,CallInfo callInfo,...)

{
  uint32 index;
  PCWSTR *ppWVar1;
  uint64 index_00;
  Type *pTVar2;
  Type TVar3;
  ScriptContext *scriptContext;
  SparseArraySegmentBase *pSVar4;
  Recycler *recycler;
  JavascriptLibrary *pJVar5;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  BOOL BVar10;
  uint32 uVar11;
  uint uVar12;
  undefined4 *puVar13;
  Var pvVar14;
  JavascriptArray *pJVar15;
  uint64 uVar16;
  Var newValue;
  uint32 index_01;
  undefined1 *value;
  int in_stack_00000010;
  BigIndex local_b0;
  CallInfo local_a0;
  CallInfo callInfo_local;
  ArgumentReader args;
  BigIndex length;
  ThrowTypeErrorOnFailureHelper h;
  JsReentLock jsReentLock;
  Var res;
  RecyclableObject *dynamicObject;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_a0 = callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1765,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) goto LAB_00a4a707;
    *puVar13 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_a0,(Var *)&stack0x00000018);
  dynamicObject =
       (RecyclableObject *)
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  h.m_functionName = (PCWSTR)((ScriptContext *)dynamicObject)->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)h.m_functionName)->noJsReentrancy;
  ((ThreadContext *)h.m_functionName)->noJsReentrancy = true;
  pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  JsReentLock::setObjectForMutation((JsReentLock *)&h.m_functionName,pvVar14);
  if (((ulong)local_a0 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x176a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar7) {
LAB_00a4a707:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar13 = 0;
  }
  jsReentLock._24_8_ = (dynamicObject->type).ptr[0x1a].propertyCache.ptr;
  if ((callInfo_local._0_4_ & 0xffffff) == 0) goto LAB_00a4a4f0;
  pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  bVar7 = IsNonES5Array(pvVar14);
  if (bVar7) {
    pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    pJVar15 = VarTo<Js::JavascriptArray>(pvVar14);
    iVar9 = (*(pJVar15->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])(pJVar15);
    if (iVar9 == 0) {
      pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      pJVar15 = UnsafeVarTo<Js::JavascriptArray>(pvVar14);
      bVar7 = HasAnyES5ArrayInPrototypeChain(pJVar15,false);
      if (!bVar7) {
        pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
        pJVar15 = UnsafeVarTo<Js::JavascriptArray>(pvVar14);
        TVar3 = (pJVar15->super_ArrayObject).length;
        if (TVar3 == 0) goto LAB_00a4a4f0;
        bVar7 = IsFillFromPrototypes(pJVar15);
        if (bVar7) {
          FillFromPrototypes(pJVar15,0,(pJVar15->super_ArrayObject).length);
        }
        if (TVar3 != (pJVar15->super_ArrayObject).length) {
          Throw::FatalInternalError(-0x7fffbffb);
        }
        bVar7 = HasNoMissingValues(pJVar15);
        if (((bVar7) && (pSVar4 = (pJVar15->head).ptr, pSVar4 != (SparseArraySegmentBase *)0x0)) &&
           ((pSVar4->next).ptr != (SparseArraySegmentBase *)0x0)) {
          SetHasNoMissingValues(pJVar15,false);
        }
        pTVar2 = &(pJVar15->super_ArrayObject).length;
        *pTVar2 = *pTVar2 - 1;
        ClearSegmentMap(pJVar15);
        recycler = (Recycler *)
                   dynamicObject[0x120].super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject;
        bVar7 = VarIsImpl<Js::JavascriptNativeIntArray>((RecyclableObject *)pJVar15);
        if (bVar7) {
          bVar8 = false;
        }
        else {
          bVar8 = VarIsImpl<Js::JavascriptNativeFloatArray>((RecyclableObject *)pJVar15);
        }
        length.bigIndex = (uint64)dynamicObject[0x3b].type.ptr;
        h.m_scriptContext = (ScriptContext *)CONCAT53(h.m_scriptContext._3_5_,0x10000);
        pJVar5 = (((Type *)(length.bigIndex + 0x16f8))->javascriptLibrary).ptr;
        if (pJVar5 != (JavascriptLibrary *)0x0) {
          h.m_scriptContext =
               (ScriptContext *)
               ((ulong)CONCAT61(h.m_scriptContext._2_6_,
                                *(undefined1 *)
                                 &(pJVar5->super_JavascriptLibraryBase).setConstructor.ptr) << 8);
          *(undefined1 *)&(pJVar5->super_JavascriptLibraryBase).setConstructor.ptr = 1;
        }
        pSVar4 = (pJVar15->head).ptr;
        if (pSVar4->length == 0) {
          if (bVar7) goto LAB_00a4a691;
          if (bVar8 != false) goto LAB_00a4a6ba;
LAB_00a4a6e9:
          ShiftHelper<void*>(pJVar15,(ScriptContext *)dynamicObject);
        }
        else if (bVar7) {
          uVar12 = SparseArraySegment<int>::GetElement((SparseArraySegment<int> *)pSVar4,0);
          if (uVar12 == 0xfff80002) {
            jsReentLock._24_8_ = (dynamicObject->type).ptr[0x1a].propertyCache.ptr;
          }
          else {
            jsReentLock._24_8_ = (ulong)uVar12 | 0x1000000000000;
          }
          SparseArraySegment<int>::RemoveElement
                    ((SparseArraySegment<int> *)(pJVar15->head).ptr,recycler,0);
LAB_00a4a691:
          ShiftHelper<int>(pJVar15,(ScriptContext *)dynamicObject);
        }
        else {
          if (bVar8 == false) {
            jsReentLock._24_8_ =
                 SparseArraySegment<void_*>::GetElement((SparseArraySegment<void_*> *)pSVar4,0);
            if ((undefined1 *)jsReentLock._24_8_ == &DAT_40002fff80002) {
              jsReentLock._24_8_ = (dynamicObject->type).ptr[0x1a].propertyCache.ptr;
            }
            else {
              jsReentLock._24_8_ =
                   CrossSite::MarshalVar
                             ((ScriptContext *)dynamicObject,(Var)jsReentLock._24_8_,false);
            }
            SparseArraySegment<void_*>::RemoveElement
                      ((SparseArraySegment<void_*> *)(pJVar15->head).ptr,recycler,0);
            goto LAB_00a4a6e9;
          }
          value = (undefined1 *)
                  SparseArraySegment<double>::GetElement((SparseArraySegment<double> *)pSVar4,0);
          if (value == &DAT_fff80002fff80002) {
            jsReentLock._24_8_ = (dynamicObject->type).ptr[0x1a].propertyCache.ptr;
          }
          else {
            jsReentLock._24_8_ =
                 JavascriptNumber::ToVarNoCheck((double)value,(ScriptContext *)dynamicObject);
          }
          SparseArraySegment<double>::RemoveElement
                    ((SparseArraySegment<double> *)(pJVar15->head).ptr,recycler,0);
LAB_00a4a6ba:
          ShiftHelper<double>(pJVar15,(ScriptContext *)dynamicObject);
        }
        h.m_scriptContext = (ScriptContext *)CONCAT71(h.m_scriptContext._1_7_,1);
        AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)&length.bigIndex);
        goto LAB_00a4a4f0;
      }
    }
  }
  res = (Var)0x0;
  pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  BVar10 = JavascriptConversion::ToObject
                     (pvVar14,(ScriptContext *)dynamicObject,(RecyclableObject **)&res);
  if (BVar10 == 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)dynamicObject,-0x7ff5ec42,L"Array.prototype.shift");
  }
  length.bigIndex = (uint64)dynamicObject;
  h.m_scriptContext = (ScriptContext *)anon_var_dwarf_6940ed4;
  *(undefined1 *)(h.m_functionName + 0x84) = jsReentLock.m_arrayObject2._0_1_;
  uVar16 = OP_GetLength(res,(ScriptContext *)dynamicObject);
  BigIndex::BigIndex((BigIndex *)&args.super_Arguments.Values,uVar16);
  JsReentLock::MutateArrayObject((JsReentLock *)&h.m_functionName);
  *(undefined1 *)(h.m_functionName + 0x84) = 1;
  BigIndex::BigIndex(&local_b0,0);
  bVar7 = BigIndex::operator==((BigIndex *)&args.super_Arguments.Values,&local_b0);
  *(undefined1 *)(h.m_functionName + 0x84) = jsReentLock.m_arrayObject2._0_1_;
  if (bVar7) {
    BVar10 = JavascriptOperators::SetProperty
                       (res,(RecyclableObject *)res,0xd1,&DAT_1000000000000,
                        (ScriptContext *)dynamicObject,PropertyOperation_ThrowIfNotExtensible);
    ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
              ((ThrowTypeErrorOnFailureHelper *)&length.bigIndex,BVar10);
    JsReentLock::MutateArrayObject((JsReentLock *)&h.m_functionName);
    *(undefined1 *)(h.m_functionName + 0x84) = 1;
    jsReentLock._24_8_ = (dynamicObject->type).ptr[0x1a].propertyCache.ptr;
  }
  else {
    BVar10 = JavascriptOperators::GetItem
                       ((RecyclableObject *)res,0,(Var *)&jsReentLock.m_savedNoJsReentrancy,
                        (ScriptContext *)dynamicObject);
    JsReentLock::MutateArrayObject((JsReentLock *)&h.m_functionName);
    *(undefined1 *)(h.m_functionName + 0x84) = 1;
    if (BVar10 == 0) {
      jsReentLock._24_8_ = (dynamicObject->type).ptr[0x1a].propertyCache.ptr;
    }
    BigIndex::operator--((BigIndex *)&args.super_Arguments.Values);
    if ((int)args.super_Arguments.Values == -1) {
      uVar11 = 0xffffffff;
    }
    else {
      uVar11 = BigIndex::GetSmallIndex((BigIndex *)&args.super_Arguments.Values);
    }
    ppWVar1 = &h.m_functionName;
    index_01 = 0;
    while (uVar11 != index_01) {
      *(undefined1 *)(h.m_functionName + 0x84) = jsReentLock.m_arrayObject2._0_1_;
      index = index_01 + 1;
      BVar10 = JavascriptOperators::HasItem((RecyclableObject *)res,index);
      JsReentLock::MutateArrayObject((JsReentLock *)ppWVar1);
      *(undefined1 *)(h.m_functionName + 0x84) = 1;
      *(undefined1 *)(h.m_functionName + 0x84) = jsReentLock.m_arrayObject2._0_1_;
      if (BVar10 == 0) {
        BVar10 = JavascriptOperators::DeleteItem
                           ((RecyclableObject *)res,index_01,
                            PropertyOperation_ThrowOnDeleteIfNotConfig);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&length.bigIndex,BVar10);
        JsReentLock::MutateArrayObject((JsReentLock *)ppWVar1);
      }
      else {
        pvVar14 = JavascriptOperators::GetItem
                            ((RecyclableObject *)res,index,(ScriptContext *)dynamicObject);
        BVar10 = JavascriptOperators::SetItem
                           (res,(RecyclableObject *)res,index_01,pvVar14,
                            (ScriptContext *)dynamicObject,PropertyOperation_ThrowIfNotExtensible,1)
        ;
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&length.bigIndex,BVar10);
        JsReentLock::MutateArrayObject((JsReentLock *)ppWVar1);
      }
      *(undefined1 *)(h.m_functionName + 0x84) = 1;
      index_01 = index;
    }
    ppWVar1 = &h.m_functionName;
    uVar16 = 0xffffffff;
    while( true ) {
      BigIndex::BigIndex(&local_b0,uVar16);
      bVar7 = BigIndex::operator>((BigIndex *)&args.super_Arguments.Values,&local_b0);
      pvVar14 = res;
      if (!bVar7) break;
      *(undefined1 *)(h.m_functionName + 0x84) = jsReentLock.m_arrayObject2._0_1_;
      index_00 = uVar16 + 1;
      BVar10 = JavascriptOperators::HasItem((RecyclableObject *)res,index_00);
      JsReentLock::MutateArrayObject((JsReentLock *)ppWVar1);
      *(undefined1 *)(h.m_functionName + 0x84) = 1;
      *(undefined1 *)(h.m_functionName + 0x84) = jsReentLock.m_arrayObject2._0_1_;
      if (BVar10 == 0) {
        BVar10 = JavascriptOperators::DeleteItem
                           ((RecyclableObject *)res,uVar16,
                            PropertyOperation_ThrowOnDeleteIfNotConfig);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&length.bigIndex,BVar10);
        JsReentLock::MutateArrayObject((JsReentLock *)ppWVar1);
      }
      else {
        pvVar14 = JavascriptOperators::GetItem
                            ((RecyclableObject *)res,index_00,(ScriptContext *)dynamicObject);
        BVar10 = JavascriptOperators::SetItem
                           (res,(RecyclableObject *)res,uVar16,pvVar14,
                            (ScriptContext *)dynamicObject,PropertyOperation_ThrowIfNotExtensible);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&length.bigIndex,BVar10);
        JsReentLock::MutateArrayObject((JsReentLock *)ppWVar1);
      }
      *(undefined1 *)(h.m_functionName + 0x84) = 1;
      uVar16 = index_00;
    }
    *(undefined1 *)(h.m_functionName + 0x84) = jsReentLock.m_arrayObject2._0_1_;
    if ((int)args.super_Arguments.Values == -1) {
      uVar16 = BigIndex::GetBigIndex((BigIndex *)&args.super_Arguments.Values);
      BVar10 = JavascriptOperators::DeleteItem
                         ((RecyclableObject *)pvVar14,uVar16,
                          PropertyOperation_ThrowOnDeleteIfNotConfig);
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)&length.bigIndex,BVar10);
      pvVar14 = res;
      uVar16 = BigIndex::GetBigIndex((BigIndex *)&args.super_Arguments.Values);
      newValue = JavascriptNumber::ToVar(uVar16,(ScriptContext *)dynamicObject);
    }
    else {
      uVar11 = BigIndex::GetSmallIndex((BigIndex *)&args.super_Arguments.Values);
      BVar10 = JavascriptOperators::DeleteItem
                         ((RecyclableObject *)pvVar14,uVar11,
                          PropertyOperation_ThrowOnDeleteIfNotConfig);
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)&length.bigIndex,BVar10);
      pvVar14 = res;
      uVar11 = BigIndex::GetSmallIndex((BigIndex *)&args.super_Arguments.Values);
      newValue = JavascriptNumber::ToVar(uVar11,(ScriptContext *)dynamicObject);
    }
    BVar10 = JavascriptOperators::SetProperty
                       (pvVar14,(RecyclableObject *)pvVar14,0xd1,newValue,
                        (ScriptContext *)dynamicObject,PropertyOperation_ThrowIfNotExtensible);
    ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
              ((ThrowTypeErrorOnFailureHelper *)&length.bigIndex,BVar10);
    JsReentLock::MutateArrayObject((JsReentLock *)&h.m_functionName);
    *(undefined1 *)(h.m_functionName + 0x84) = 1;
  }
LAB_00a4a4f0:
  *(undefined1 *)(h.m_functionName + 0x84) = jsReentLock.m_arrayObject2._0_1_;
  return (Var)jsReentLock._24_8_;
}

Assistant:

Var JavascriptArray::EntryShift(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Shift);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        Assert(!(callInfo.Flags & CallFlags_New));

        Var res = scriptContext->GetLibrary()->GetUndefined();

        if (args.Info.Count == 0)
        {
            return res;
        }

        bool useNoSideEffectShift = JavascriptArray::IsNonES5Array(args[0])
            && !VarTo<JavascriptArray>(args[0])->IsCrossSiteObject()
            && !HasAnyES5ArrayInPrototypeChain(UnsafeVarTo<JavascriptArray>(args[0]));

        if (useNoSideEffectShift)
        {
            JavascriptArray * pArr = UnsafeVarTo<JavascriptArray>(args[0]);

            if (pArr->length == 0)
            {
                return res;
            }

            uint32 length = pArr->length;

            if(pArr->IsFillFromPrototypes())
            {
                pArr->FillFromPrototypes(0, pArr->length); // We need find all missing value from [[proto]] object
            }

            // As we have already established that the FillFromPrototype should not change the bound of the array.
            if (length != pArr->length)
            {
                Js::Throw::FatalInternalError();
            }

            if(pArr->HasNoMissingValues() && pArr->head && pArr->head->next)
            {
                // This function currently does not track missing values in the head segment if there are multiple segments
                pArr->SetHasNoMissingValues(false);
            }

            pArr->length--;

            pArr->ClearSegmentMap(); // Dump segmentMap on shift (before any allocation)

            Recycler * recycler = scriptContext->GetRecycler();

            bool isIntArray = false;
            bool isFloatArray = false;

            if(VarIs<JavascriptNativeIntArray>(pArr))
            {
                isIntArray = true;
            }
            else if(VarIs<JavascriptNativeFloatArray>(pArr))
            {
                isFloatArray = true;
            }

            // Code below has potential to throw due to OOM or SO. Just FailFast on those cases
            AutoDisableInterrupt failFastOnError(scriptContext->GetThreadContext());

            if (pArr->head->length != 0)
            {
                if(isIntArray)
                {
                    int32 nativeResult = SparseArraySegment<int32>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<int32>::IsMissingItem(&nativeResult))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = Js::JavascriptNumber::ToVar(nativeResult, scriptContext);
                    }
                    SparseArraySegment<int32>::From(pArr->head)->RemoveElement(recycler, 0);
                }
                else if (isFloatArray)
                {
                    double nativeResult = SparseArraySegment<double>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<double>::IsMissingItem(&nativeResult))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = Js::JavascriptNumber::ToVarNoCheck(nativeResult, scriptContext);
                    }
                    SparseArraySegment<double>::From(pArr->head)->RemoveElement(recycler, 0);
                }
                else
                {
                    res = SparseArraySegment<Var>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<Var>::IsMissingItem(&res))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = CrossSite::MarshalVar(scriptContext, res);
                    }
                    SparseArraySegment<Var>::From(pArr->head)->RemoveElement(recycler, 0);
                }
            }

            if(isIntArray)
            {
                ShiftHelper<int32>(pArr, scriptContext);
            }
            else if (isFloatArray)
            {
                ShiftHelper<double>(pArr, scriptContext);
            }
            else
            {
                ShiftHelper<Var>(pArr, scriptContext);
            }
            failFastOnError.Completed();

        }
        else
        {
            RecyclableObject* dynamicObject = nullptr;
            if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &dynamicObject))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.shift"));
            }

            ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.shift"));

            JS_REENTRANT(jsReentLock, BigIndex length = OP_GetLength(dynamicObject, scriptContext));

            if (length == 0u)
            {
                // If length is 0, return 'undefined'
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, TaggedInt::ToVarUnchecked(0), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                return scriptContext->GetLibrary()->GetUndefined();
            }

            JS_REENTRANT(jsReentLock,
                BOOL gotItem = JavascriptOperators::GetItem(dynamicObject, 0u, &res, scriptContext));
            if (!gotItem)
            {
                res = scriptContext->GetLibrary()->GetUndefined();
            }
            --length;
            uint32 lengthToUin32Max = length.IsSmallIndex() ? length.GetSmallIndex() : MaxArrayLength;
            for (uint32 i = 0u; i < lengthToUin32Max; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(dynamicObject, i + 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock,
                        element = JavascriptOperators::GetItem(dynamicObject, i + 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(dynamicObject, dynamicObject, i, element, scriptContext, PropertyOperation_ThrowIfNotExtensible, /*skipPrototypeCheck*/ true)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, i, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
            }

            for (uint64 i = MaxArrayLength; length > i; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(dynamicObject, i + 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock,
                        element = JavascriptOperators::GetItem(dynamicObject, i + 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(dynamicObject, dynamicObject, i, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, i, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
            }

            if (length.IsSmallIndex())
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, length.GetSmallIndex(), PropertyOperation_ThrowOnDeleteIfNotConfig)),
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, JavascriptNumber::ToVar(length.GetSmallIndex(), scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
            }
            else
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, length.GetBigIndex(), PropertyOperation_ThrowOnDeleteIfNotConfig)),
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, JavascriptNumber::ToVar(length.GetBigIndex(), scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
            }
        }
        return res;
        JIT_HELPER_END(Array_Shift);
    }